

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O3

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>_>
         *this)

{
  EVP_PKEY_CTX *in_RSI;
  CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  obj;
  SmallVectorBase<(anonymous_namespace)::Constructable> local_70;
  SmallVectorBase<(anonymous_namespace)::Constructable> local_38;
  
  ::(anonymous_namespace)::Constructable::numConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numDestructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyAssignmentCalls = 0;
  local_70.data_ = (pointer)local_70.firstElement;
  local_70.len = 0;
  local_70.cap = 4;
  local_38.data_ = (pointer)local_38.firstElement;
  local_38.len = 0;
  local_38.cap = 2;
  (*(code *)this->m_testAsMethod)(local_70.firstElement + *(long *)&this->field_0x10 + -0x18);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup(&local_38,in_RSI);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup(&local_70,in_RSI);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }